

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

bool google::protobuf::safe_uint_internal<unsigned_long>(string *text,unsigned_long *value_p)

{
  char *pcVar1;
  char cVar2;
  pointer pcVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  *value_p = 0;
  pcVar5 = (text->_M_dataplus)._M_p;
  pcVar1 = pcVar5 + text->_M_string_length;
  if (0 < (long)text->_M_string_length) {
    do {
      if (*pcVar5 != ' ') break;
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 < pcVar1);
  }
  do {
    pcVar6 = pcVar1;
    if (pcVar6 <= pcVar5) {
      return false;
    }
    pcVar1 = pcVar6 + -1;
  } while (pcVar6[-1] == ' ');
  cVar2 = *pcVar5;
  if (((cVar2 != '-') && (cVar2 != '+')) || (pcVar5 + 1 < pcVar6)) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)text);
    std::__cxx11::string::operator=((string *)text,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    if (cVar2 != '-') {
      pcVar3 = (text->_M_dataplus)._M_p;
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar3,pcVar3 + text->_M_string_length);
      bVar4 = safe_parse_positive_int<unsigned_long>(&local_60,value_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
        return bVar4;
      }
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool safe_uint_internal(string text, IntType* value_p) {
  *value_p = 0;
  bool negative;
  if (!safe_parse_sign(&text, &negative) || negative) {
    return false;
  }
  return safe_parse_positive_int(text, value_p);
}